

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# import.c
# Opt level: O3

sshcom_key * load_sshcom_key(BinarySource *src,char **errmsg_p)

{
  byte bVar1;
  long lVar2;
  int iVar3;
  uint uVar4;
  sshcom_key *__dest;
  strbuf *psVar5;
  size_t sVar6;
  char *pcVar7;
  ushort **ppuVar8;
  bool bVar9;
  long lVar10;
  long lVar11;
  byte *__s;
  char *pcVar12;
  byte *pbVar13;
  long lVar14;
  ptrlen pVar15;
  char base64_bit [4];
  uchar out [3];
  byte *local_60;
  int local_54;
  byte local_37 [4];
  uchar local_33 [3];
  
  __dest = (sshcom_key *)safemalloc(1,0x108,0);
  __dest->comment[0] = '\0';
  psVar5 = strbuf_new_nm();
  __dest->keyblob = psVar5;
  pVar15 = BinarySource_get_chomped_line(src->binarysource_);
  pcVar12 = "unexpected end of file";
  if ((src->binarysource_->err == BSE_NO_ERROR) &&
     (local_60 = (byte *)mkstr(pVar15), local_60 != (byte *)0x0)) {
    iVar3 = strcmp((char *)local_60,"---- BEGIN SSH2 ENCRYPTED PRIVATE KEY ----");
    if (iVar3 == 0) {
      sVar6 = strlen((char *)local_60);
      smemclr(local_60,sVar6);
      safefree(local_60);
      pVar15 = BinarySource_get_chomped_line(src->binarysource_);
      if (src->binarysource_->err == BSE_NO_ERROR) {
        local_54 = 0;
        bVar9 = false;
        do {
          pcVar12 = "unexpected end of file";
          local_60 = (byte *)mkstr(pVar15);
          if (local_60 == (byte *)0x0) break;
          iVar3 = strcmp((char *)local_60,"---- END SSH2 ENCRYPTED PRIVATE KEY ----");
          if (iVar3 == 0) {
            safefree(local_60);
            if (__dest->keyblob->len != 0) {
              if (errmsg_p == (char **)0x0) {
                return __dest;
              }
              pcVar12 = (char *)0x0;
              goto LAB_001160bb;
            }
            pcVar12 = "key body not present";
            break;
          }
          pcVar7 = strchr((char *)local_60,0x3a);
          if (pcVar7 == (char *)0x0) {
            pbVar13 = local_60;
            while (((bVar1 = *pbVar13, (byte)(bVar1 - 0x30) < 10 ||
                    ((byte)((bVar1 & 0xdf) + 0xbf) < 0x1a)) ||
                   ((bVar1 < 0x3e && ((0x2000880000000000U >> ((ulong)(uint)bVar1 & 0x3f) & 1) != 0)
                    )))) {
              lVar10 = (long)local_54;
              local_54 = local_54 + 1;
              local_37[lVar10] = bVar1;
              if (local_54 == 4) {
                uVar4 = base64_decode_atom((char *)local_37,local_33);
                if ((int)uVar4 < 1) {
                  pcVar12 = "invalid base64 encoding";
                  goto LAB_00116047;
                }
                BinarySink_put_data(__dest->keyblob->binarysink_,local_33,(ulong)uVar4);
                local_54 = 0;
              }
              pbVar13 = pbVar13 + 1;
            }
          }
          else {
            if (bVar9) {
              pcVar12 = "header found in body of key data";
              goto LAB_00116047;
            }
            *pcVar7 = '\0';
            pbVar13 = (byte *)(pcVar7 + 1);
            iVar3 = (int)pcVar7 - (int)local_60;
            lVar10 = (long)pbVar13 - (long)local_60;
            lVar2 = (long)pbVar13 - (long)local_60 << 0x20;
            do {
              lVar11 = lVar2;
              lVar14 = lVar10;
              iVar3 = iVar3 + 1;
              bVar1 = *pbVar13;
              if ((ulong)bVar1 == 0) break;
              ppuVar8 = __ctype_b_loc();
              pbVar13 = pbVar13 + 1;
              lVar10 = lVar14 + 1;
              lVar2 = lVar11 + 0x100000000;
            } while ((*(byte *)((long)*ppuVar8 + (ulong)bVar1 * 2 + 1) & 0x20) != 0);
            lVar11 = lVar11 >> 0x20;
            sVar6 = strlen((char *)(local_60 + lVar11));
            lVar14 = lVar14 + sVar6;
            if (local_60[(int)lVar14] != 0) {
              __assert_fail("!line[len]",
                            "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/import.c"
                            ,0x6fd,
                            "struct sshcom_key *load_sshcom_key(BinarySource *, const char **)");
            }
            if (local_60[(lVar14 << 0x20) + -0x100000000 >> 0x20] == 0x5c) {
              iVar3 = (int)sVar6 + iVar3;
              do {
                pVar15 = BinarySource_get_chomped_line(src->binarysource_);
                if ((src->binarysource_->err != BSE_NO_ERROR) ||
                   (pcVar12 = mkstr(pVar15), pcVar12 == (char *)0x0)) {
                  pcVar12 = "unexpected end of file";
                  goto LAB_00116047;
                }
                sVar6 = strlen(pcVar12);
                local_60 = (byte *)saferealloc(local_60,(long)((int)sVar6 + iVar3 + 1),1);
                strcpy((char *)(local_60 + (long)iVar3 + -1),pcVar12);
                iVar3 = iVar3 + (int)sVar6 + -1;
                if (local_60[iVar3] != 0) {
                  __assert_fail("!line[len]",
                                "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/import.c"
                                ,0x70c,
                                "struct sshcom_key *load_sshcom_key(BinarySource *, const char **)")
                  ;
                }
                sVar6 = strlen(pcVar12);
                smemclr(pcVar12,sVar6);
                safefree(pcVar12);
              } while (local_60[(long)iVar3 + -1] == 0x5c);
            }
            iVar3 = strcmp((char *)local_60,"Comment");
            if (iVar3 == 0) {
              __s = local_60 + lVar11;
              pbVar13 = __s;
              if ((*__s == 0x22) && (sVar6 = strlen((char *)__s), __s[sVar6 - 1] == 0x22)) {
                pbVar13 = __s + 1;
                sVar6 = strlen((char *)pbVar13);
                __s[sVar6] = 0;
              }
              strncpy((char *)__dest,(char *)pbVar13,0x100);
              __dest->comment[0xff] = '\0';
            }
          }
          pcVar12 = "unexpected end of file";
          sVar6 = strlen((char *)local_60);
          smemclr(local_60,sVar6);
          safefree(local_60);
          pVar15 = BinarySource_get_chomped_line(src->binarysource_);
          bVar9 = pcVar7 == (char *)0x0;
        } while (src->binarysource_->err == BSE_NO_ERROR);
      }
    }
    else {
      pcVar12 = "file does not begin with ssh.com key header";
LAB_00116047:
      sVar6 = strlen((char *)local_60);
      smemclr(local_60,sVar6);
      safefree(local_60);
    }
  }
  strbuf_free(__dest->keyblob);
  smemclr(__dest,0x108);
  safefree(__dest);
  __dest = (sshcom_key *)0x0;
  if (errmsg_p != (char **)0x0) {
LAB_001160bb:
    *errmsg_p = pcVar12;
  }
  return __dest;
}

Assistant:

static struct sshcom_key *load_sshcom_key(BinarySource *src,
                                          const char **errmsg_p)
{
    struct sshcom_key *ret;
    char *line = NULL;
    int hdrstart, len;
    const char *errmsg;
    char *p;
    bool headers_done;
    char base64_bit[4];
    int base64_chars = 0;

    ret = snew(struct sshcom_key);
    ret->comment[0] = '\0';
    ret->keyblob = strbuf_new_nm();

    if (!(line = bsgetline(src))) {
        errmsg = "unexpected end of file";
        goto error;
    }
    if (0 != strcmp(line, "---- BEGIN SSH2 ENCRYPTED PRIVATE KEY ----")) {
        errmsg = "file does not begin with ssh.com key header";
        goto error;
    }
    smemclr(line, strlen(line));
    sfree(line);
    line = NULL;

    headers_done = false;
    while (1) {
        if (!(line = bsgetline(src))) {
            errmsg = "unexpected end of file";
            goto error;
        }
        if (!strcmp(line, "---- END SSH2 ENCRYPTED PRIVATE KEY ----")) {
            sfree(line);
            line = NULL;
            break;                     /* done */
        }
        if ((p = strchr(line, ':')) != NULL) {
            if (headers_done) {
                errmsg = "header found in body of key data";
                goto error;
            }
            *p++ = '\0';
            while (*p && isspace((unsigned char)*p)) p++;
            hdrstart = p - line;

            /*
             * Header lines can end in a trailing backslash for
             * continuation.
             */
            len = hdrstart + strlen(line+hdrstart);
            assert(!line[len]);
            while (line[len-1] == '\\') {
                char *line2;
                int line2len;

                line2 = bsgetline(src);
                if (!line2) {
                    errmsg = "unexpected end of file";
                    goto error;
                }

                line2len = strlen(line2);
                line = sresize(line, len + line2len + 1, char);
                strcpy(line + len - 1, line2);
                len += line2len - 1;
                assert(!line[len]);

                smemclr(line2, strlen(line2));
                sfree(line2);
                line2 = NULL;
            }
            p = line + hdrstart;
            if (!strcmp(line, "Comment")) {
                /* Strip quotes in comment if present. */
                if (p[0] == '"' && p[strlen(p)-1] == '"') {
                    p++;
                    p[strlen(p)-1] = '\0';
                }
                strncpy(ret->comment, p, sizeof(ret->comment));
                ret->comment[sizeof(ret->comment)-1] = '\0';
            }
        } else {
            headers_done = true;

            p = line;
            while (isbase64(*p)) {
                base64_bit[base64_chars++] = *p;
                if (base64_chars == 4) {
                    unsigned char out[3];

                    base64_chars = 0;

                    len = base64_decode_atom(base64_bit, out);

                    if (len <= 0) {
                        errmsg = "invalid base64 encoding";
                        goto error;
                    }

                    put_data(ret->keyblob, out, len);
                }

                p++;
            }
        }
        smemclr(line, strlen(line));
        sfree(line);
        line = NULL;
    }

    if (ret->keyblob->len == 0) {
        errmsg = "key body not present";
        goto error;
    }

    if (errmsg_p) *errmsg_p = NULL;
    return ret;

    error:
    if (line) {
        smemclr(line, strlen(line));
        sfree(line);
        line = NULL;
    }
    if (ret) {
        strbuf_free(ret->keyblob);
        smemclr(ret, sizeof(*ret));
        sfree(ret);
    }
    if (errmsg_p) *errmsg_p = errmsg;
    return NULL;
}